

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrqfa.cc
# Opt level: O3

base_learner * lrqfa_setup(options_i *options,vw *all)

{
  size_type *__s;
  undefined4 uVar1;
  size_type sVar2;
  pointer pcVar3;
  vw *all_00;
  long *plVar4;
  int iVar5;
  LRQFAstate *pLVar6;
  base_learner *l;
  single_learner *__src;
  learner<LRQFAstate,_example> *__dest;
  size_type sVar7;
  long lVar8;
  string *__range1;
  size_type __dnew_1;
  string lrqfa;
  option_group_definition new_options;
  string lrqopt;
  _func_int ***local_198;
  _func_int **local_190;
  _func_int **local_188 [2];
  vw *local_178;
  long *local_170;
  long local_168;
  long local_160 [2];
  long local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  option_group_definition local_128;
  undefined1 local_f0 [48];
  string local_c0 [64];
  bool local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  string local_50;
  
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  local_f0._0_8_ = (_func_int **)0x16;
  local_198 = local_188;
  local_198 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_198,(ulong)local_f0);
  local_188[0] = (_func_int **)local_f0._0_8_;
  *(undefined4 *)local_198 = 0x20776f4c;
  builtin_strncpy((char *)((long)local_198 + 4),"Rank",4);
  *(undefined4 *)(local_198 + 1) = 0x61755120;
  builtin_strncpy((char *)((long)local_198 + 0xc),"drat",4);
  builtin_strncpy((char *)((long)local_198 + 0xe),"atics FA",8);
  local_190 = (_func_int **)local_f0._0_8_;
  *(char *)((long)local_198 + local_f0._0_8_) = '\0';
  local_128.m_name._M_dataplus._M_p = (pointer)&local_128.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,local_198,(pointer)(local_f0._0_8_ + (long)local_198));
  local_128.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  local_50.field_2._M_allocated_capacity._0_4_ = 0x6671726c;
  local_50.field_2._M_allocated_capacity._4_2_ = 0x61;
  local_50._M_string_length = 5;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_f0,&local_50,&local_148);
  local_80 = true;
  local_150 = 0x38;
  local_170 = local_160;
  local_170 = (long *)std::__cxx11::string::_M_create((ulong *)&local_170,(ulong)&local_150);
  local_160[0] = local_150;
  local_170[4] = 0x6569662068746977;
  local_170[5] = 0x657261776120646c;
  local_170[2] = 0x6620636974617264;
  local_170[3] = 0x2073657275746165;
  *local_170 = 0x20776f6c20657375;
  local_170[1] = 0x617571206b6e6172;
  local_170[6] = 0x7374686769657720;
  local_168 = local_150;
  *(char *)((long)local_170 + local_150) = '\0';
  std::__cxx11::string::_M_assign(local_c0);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_128,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_f0);
  if (local_170 != local_160) {
    operator_delete(local_170);
  }
  local_f0._0_8_ = &PTR__typed_option_002dc140;
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_128);
  local_f0._16_4_ = 0x6671726c;
  local_f0._20_2_ = 0x61;
  local_f0._8_8_ = (pointer)0x5;
  local_f0._0_8_ = local_f0 + 0x10;
  iVar5 = (*options->_vptr_options_i[1])(options);
  if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
    operator_delete((void *)local_f0._0_8_);
  }
  if ((char)iVar5 == '\0') {
    __dest = (learner<LRQFAstate,_example> *)0x0;
  }
  else {
    pLVar6 = calloc_or_throw<LRQFAstate>(1);
    __s = &(pLVar6->field_name)._M_string_length;
    memset(__s,0,0xc20);
    (pLVar6->field_name)._M_dataplus._M_p = (pointer)&(pLVar6->field_name).field_2;
    pLVar6->all = all;
    local_178 = all;
    spoof_hex_encoded_namespaces((string *)local_f0,&local_148);
    std::__cxx11::string::find_last_not_of(local_f0,0x289982,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)&pLVar6->field_name,(ulong)local_f0);
    std::__cxx11::string::substr((ulong)&local_170,(ulong)local_f0);
    plVar4 = local_170;
    iVar5 = atoi((char *)local_170);
    all_00 = local_178;
    pLVar6->k = iVar5;
    if (plVar4 != local_160) {
      operator_delete(plVar4);
    }
    sVar2 = *__s;
    if (sVar2 != 0) {
      pcVar3 = (pLVar6->field_name)._M_dataplus._M_p;
      sVar7 = 0;
      do {
        pLVar6->field_id[pcVar3[sVar7]] = (int)sVar7;
        sVar7 = sVar7 + 1;
      } while (sVar2 != sVar7);
    }
    all_00->wpp = (pLVar6->k + 1) * all_00->wpp;
    l = setup_base(options,all_00);
    __src = LEARNER::as_singleline<char,char>(l);
    sVar2 = (pLVar6->field_name)._M_string_length;
    iVar5 = pLVar6->k;
    uVar1 = *(undefined4 *)(__src + 0xd0);
    __dest = calloc_or_throw<LEARNER::learner<LRQFAstate,example>>(1);
    lVar8 = sVar2 * (long)iVar5 + 1;
    memcpy(__dest,__src,0xe9);
    *(single_learner **)(__dest + 0x20) = __src;
    *(code **)(__dest + 0x50) = LEARNER::recur_sensitivity;
    *(LRQFAstate **)(__dest + 0xb8) = pLVar6;
    *(single_learner **)(__dest + 0xc0) = __src;
    *(code **)(__dest + 200) = LEARNER::noop;
    *(long *)(__dest + 0xd8) = lVar8;
    *(long *)(__dest + 0xe0) = lVar8 * *(long *)(__src + 0xe0);
    *(LRQFAstate **)(__dest + 0x18) = pLVar6;
    *(code **)(__dest + 0x28) = predict_or_learn<true>;
    *(code **)(__dest + 0x38) = predict_or_learn<true>;
    *(code **)(__dest + 0x30) = predict_or_learn<false>;
    *(undefined8 *)(__dest + 0x40) = 0;
    *(undefined4 *)(__dest + 0xd0) = uVar1;
    __dest[0xe8] = (learner<LRQFAstate,_example>)0x0;
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
      operator_delete((void *)local_f0._0_8_);
    }
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_128.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.m_name._M_dataplus._M_p != &local_128.m_name.field_2) {
    operator_delete(local_128.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  return (base_learner *)__dest;
}

Assistant:

LEARNER::base_learner* lrqfa_setup(options_i& options, vw& all)
{
  std::string lrqfa;
  option_group_definition new_options("Low Rank Quadratics FA");
  new_options.add(make_option("lrqfa", lrqfa).keep().help("use low rank quadratic features with field aware weights"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("lrqfa"))
    return nullptr;

  auto lrq = scoped_calloc_or_throw<LRQFAstate>();
  lrq->all = &all;

  string lrqopt = spoof_hex_encoded_namespaces(lrqfa);
  size_t last_index = lrqopt.find_last_not_of("0123456789");
  new (&lrq->field_name) string(lrqopt.substr(0, last_index + 1));  // make sure there is no duplicates
  lrq->k = atoi(lrqopt.substr(last_index + 1).c_str());

  int fd_id = 0;
  for (char i : lrq->field_name) lrq->field_id[(int)i] = fd_id++;

  all.wpp = all.wpp * (uint64_t)(1 + lrq->k);
  learner<LRQFAstate, example>& l = init_learner(lrq, as_singleline(setup_base(options, all)), predict_or_learn<true>,
      predict_or_learn<false>, 1 + lrq->field_name.size() * lrq->k);

  return make_base(l);
}